

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

int __thiscall HighsHashTree<int,_int>::NodePtr::numEntries(NodePtr *this)

{
  Type TVar1;
  ListLeaf *pLVar2;
  InnerLeaf<1> *pIVar3;
  InnerLeaf<2> *pIVar4;
  InnerLeaf<3> *pIVar5;
  InnerLeaf<4> *pIVar6;
  logic_error *this_00;
  NodePtr *in_RDI;
  int local_4;
  
  TVar1 = getType(in_RDI);
  switch(TVar1) {
  case kEmpty:
    local_4 = 0;
    break;
  case kListLeaf:
    pLVar2 = getListLeaf(in_RDI);
    local_4 = pLVar2->count;
    break;
  case kInnerLeafSizeClass1:
    pIVar3 = getInnerLeafSizeClass1(in_RDI);
    local_4 = pIVar3->size;
    break;
  case kInnerLeafSizeClass2:
    pIVar4 = getInnerLeafSizeClass2(in_RDI);
    local_4 = pIVar4->size;
    break;
  case kInnerLeafSizeClass3:
    pIVar5 = getInnerLeafSizeClass3(in_RDI);
    local_4 = pIVar5->size;
    break;
  case kInnerLeafSizeClass4:
    pIVar6 = getInnerLeafSizeClass4(in_RDI);
    local_4 = pIVar6->size;
    break;
  case kBranchNode:
    local_4 = 0x40;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unexpected type in hash tree");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return local_4;
}

Assistant:

int numEntries() const {
      switch (getType()) {
        case kEmpty:
          return 0;
        case kListLeaf:
          return getListLeaf()->count;
        case kInnerLeafSizeClass1:
          return getInnerLeafSizeClass1()->size;
        case kInnerLeafSizeClass2:
          return getInnerLeafSizeClass2()->size;
        case kInnerLeafSizeClass3:
          return getInnerLeafSizeClass3()->size;
        case kInnerLeafSizeClass4:
          return getInnerLeafSizeClass4()->size;
        case kBranchNode:
          // something large should be returned so that the number of entries
          // is estimated above the threshold to merge when the parent checks
          // its children after deletion
          return kBranchFactor;
        default:
          throw std::logic_error("Unexpected type in hash tree");
      }
    }